

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::RegAlloc(LinearScan *this)

{
  Type *ppAVar1;
  ScriptContextInfo *pSVar2;
  undefined1 *puVar3;
  IRKind IVar4;
  OpCode OVar5;
  Func *pFVar6;
  JitArenaAllocator *this_00;
  ScriptContextInfo *pSVar7;
  char16 *pcVar8;
  GeneratorBailInInstr *this_01;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  code *pcVar10;
  undefined8 allocator;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  BOOL BVar14;
  uint32 uVar15;
  uint uVar16;
  uint uVar17;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar18;
  BVSparse<Memory::JitArenaAllocator> *pBVar19;
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *pSVar20;
  LoweredBasicBlock *pLVar21;
  undefined4 *puVar22;
  char *dataBlock;
  GlobalBailOutRecordDataTable **ppGVar23;
  JITTimeFunctionBody *pJVar24;
  FunctionJITTimeInfo *pFVar25;
  Instr *pIVar26;
  BailOutInfo *pBVar27;
  GeneratorBailInInstr *pGVar28;
  Type pAVar29;
  ulong uVar30;
  uint uVar31;
  GeneratorBailInInstr *bailInInstr;
  uint **__s;
  size_t requestedBytes;
  undefined1 local_168 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  SCCLiveness liveness;
  undefined1 local_58 [8];
  AutoCodeGenPhase __autoCodeGen;
  
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_168,
             L"BE-LinearScan",
             (this->func->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  tempAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->tempAlloc = (JitArenaAllocator *)local_168;
  pSVar18 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_168,0x3f1274);
  (pSVar18->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  (pSVar18->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar18;
  pSVar18->allocator = (Type)local_168;
  this->opHelperSpilledLiveranges = pSVar18;
  pSVar18 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_168,0x3f1274);
  (pSVar18->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  (pSVar18->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar18;
  pSVar18->allocator = (Type)local_168;
  this->activeLiveranges = pSVar18;
  pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,(JitArenaAllocator *)local_168,0x3f1274);
  pBVar19->head = (Type_conflict)0x0;
  pBVar19->lastFoundIndex = (Type_conflict)0x0;
  pBVar19->alloc = (JitArenaAllocator *)local_168;
  pBVar19->lastUsedNodePrevNextField = (Type)pBVar19;
  this->liveOnBackEdgeSyms = pBVar19;
  pSVar18 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_168,0x3f1274);
  (pSVar18->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  (pSVar18->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar18;
  pSVar18->allocator = (Type)local_168;
  this->stackPackInUseLiveRanges = pSVar18;
  pSVar20 = (SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_168,0x3f1274);
  (pSVar20->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  (pSVar20->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar20;
  pSVar20->allocator = (Type)local_168;
  this->stackSlotsFreeList = pSVar20;
  pLVar21 = (LoweredBasicBlock *)
            new<Memory::JitArenaAllocator>(0x98,(JitArenaAllocator *)local_168,0x3f1274);
  LoweredBasicBlock::LoweredBasicBlock(pLVar21,(JitArenaAllocator *)local_168);
  this->currentBlock = pLVar21;
  bailInInstr = (GeneratorBailInInstr *)this->func->m_headInstr;
  SCCLiveness::SCCLiveness
            ((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList,this->func,this->tempAlloc
            );
  local_58 = (undefined1  [8])this->func;
  __autoCodeGen.func._0_4_ = 0xe6;
  Func::BeginPhase((Func *)local_58,LivenessPhase);
  SCCLiveness::Build((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_58,this->func,LivenessPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_58);
  this->lifetimeList =
       (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&liveness.extendedLifetimesLoopList;
  ppAVar1 = &liveness.lifetimeList.allocator;
  this->opHelperBlockList = (SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)ppAVar1;
  (this->opHelperBlockIter).list =
       (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)ppAVar1;
  (this->opHelperBlockIter).current = (NodeBase *)ppAVar1;
  pAVar29 = (Type)0x0;
  if (liveness.lifetimeList.allocator != (Type)ppAVar1) {
    pAVar29 = liveness.lifetimeList.allocator;
  }
  (this->opHelperBlockIter).current = (NodeBase *)pAVar29;
  Init(this);
  pFVar6 = this->func;
  __autoCodeGen._8_8_ = &pFVar6->topFunc->nativeCodeDataAllocator;
  if ((pFVar6->field_0x240 & 0x10) != 0) {
    uVar15 = pFVar6->m_inlineeId;
    BVar14 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar14 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar22 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                          ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                          "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar11) goto LAB_005826f2;
      *puVar22 = 0;
    }
    dataBlock = NativeCodeData::Allocator::AllocZero
                          ((Allocator *)__autoCodeGen._8_8_,(ulong)(uVar15 + 1) << 3);
    ppGVar23 = (GlobalBailOutRecordDataTable **)
               NativeCodeData::AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_>::
               AddFixup((AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_> *)
                        __autoCodeGen._8_8_,dataBlock);
    if (ppGVar23 == (GlobalBailOutRecordDataTable **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar22 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                          ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar11) goto LAB_005826f2;
      *puVar22 = 0;
    }
    this->globalBailOutRecordTables = ppGVar23;
    __s = (uint **)&DAT_00000008;
    uVar31 = this->func->m_inlineeId + 1;
    if (uVar31 != 0) {
      this_00 = this->tempAlloc;
      BVar14 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar14 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar22 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                            ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                            "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar11) goto LAB_005826f2;
        *puVar22 = 0;
      }
      uVar30 = (ulong)uVar31;
      requestedBytes = uVar30 * 8;
      __s = (uint **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)this_00,requestedBytes);
      memset(__s,0,requestedBytes);
      memset(__s + uVar30,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar30 * -8);
      if (__s == (uint **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar22 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                            ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar11) goto LAB_005826f2;
        *puVar22 = 0;
      }
    }
    this->lastUpdatedRowIndices = __s;
    if (DAT_015c7943 == '\x01') {
      pSVar7 = this->func->m_scriptContextInfo;
      uVar31 = this->func->m_inlineeId + 1;
      pSVar2 = pSVar7 + 0x120;
      pSVar2->_vptr_ScriptContextInfo = pSVar2->_vptr_ScriptContextInfo + uVar31;
      pSVar7 = pSVar7 + 0x11f;
      pSVar7->_vptr_ScriptContextInfo = pSVar7->_vptr_ScriptContextInfo + uVar31;
    }
  }
  this->m_bailOutRecordCount = 0;
  if (bailInInstr != (GeneratorBailInInstr *)0x0) {
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar11 = true;
    liveness._112_8_ = &DAT_015cd718;
    do {
      pGVar28 = (GeneratorBailInInstr *)(bailInInstr->super_LabelInstr).super_Instr.m_next;
      uVar15 = IR::Instr::GetNumber((Instr *)bailInInstr);
      if (uVar15 == 0) {
        bVar12 = LowererMD::IsAssign((Instr *)bailInInstr);
        if (!bVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0x9b,"(LowererMD::IsAssign(instr))","Only expect spill code here");
          if (!bVar12) goto LAB_005826f2;
          *puVar22 = 0;
        }
      }
      else {
        pJVar24 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar16 = JITTimeFunctionBody::GetSourceContextId(pJVar24);
        pFVar25 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar17 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
        bVar12 = Js::Phases::IsEnabled((Phases *)liveness._112_8_,LinearScanPhase,uVar16,uVar17);
        if (bVar12) {
          IR::Instr::Dump((Instr *)bailInInstr);
        }
        this->currentInstr = (Instr *)bailInInstr;
        IVar4 = (bailInInstr->super_LabelInstr).super_Instr.m_kind;
        if (((IVar4 < 7) && ((0x68U >> (IVar4 & 0x1f) & 1) != 0)) || (bVar11)) {
          this->currentBlockNumber = this->currentBlockNumber + 1;
          bVar11 = false;
        }
        if (IVar4 == InstrKindBranch) {
          BVar14 = Func::HasTry(this->func);
          if ((BVar14 != 0) && (bVar12 = Func::DoOptimizeTry(this->func), bVar12)) {
            ProcessEHRegionBoundary(this,(Instr *)bailInInstr);
          }
          if (this->loopNest == 0) goto LAB_00582131;
          uVar15 = IR::Instr::GetNumber((Instr *)bailInInstr);
          bVar12 = (this->curLoop->regAlloc).loopEnd <= uVar15;
        }
        else {
          if ((IVar4 == InstrKindProfiledLabel) || (IVar4 == InstrKindLabel)) {
            this->lastLabel = &bailInInstr->super_LabelInstr;
            if ((bailInInstr->super_LabelInstr).m_loweredBasicBlock == (LoweredBasicBlock *)0x0) {
              if ((0 < (this->currentBlock->inlineeFrameLifetimes).
                       super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                       count) ||
                 (0 < (this->currentBlock->inlineeStack).
                      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count))
              {
                pIVar26 = IR::Instr::GetPrevRealInstrOrLabel((Instr *)bailInInstr);
                if (pIVar26 == (Instr *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar22 = 1;
                  bVar12 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                      ,0xbf,"(prevInstr)","prevInstr");
                  if (!bVar12) goto LAB_005826f2;
                  *puVar22 = 0;
                }
                if (pIVar26->m_kind == InstrKindBranch) {
                  OVar5 = pIVar26->m_opcode;
                  if (OVar5 < ADD) {
                    bVar12 = OVar5 == MultiBr || OVar5 == Br;
                  }
                  else {
                    bVar12 = LowererMD::IsUnconditionalBranch(pIVar26);
                  }
                  if (bVar12 == false) goto LAB_00582344;
                }
                else {
LAB_00582344:
                  bVar12 = OpCodeAttr::HasFallThrough(pIVar26->m_opcode);
                  if (bVar12) goto LAB_0058211c;
                }
                pLVar21 = (LoweredBasicBlock *)
                          new<Memory::JitArenaAllocator>
                                    (0x98,(JitArenaAllocator *)local_168,0x3f1274);
                LoweredBasicBlock::LoweredBasicBlock(pLVar21,(JitArenaAllocator *)local_168);
                goto LAB_00582115;
              }
            }
            else {
              pIVar26 = IR::Instr::GetPrevRealInstrOrLabel((Instr *)bailInInstr);
              if (pIVar26 == (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar22 = 1;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                    ,0xb4,"(prevInstr)","prevInstr");
                if (!bVar12) goto LAB_005826f2;
                *puVar22 = 0;
              }
              if (pIVar26->m_kind == InstrKindBranch) {
                OVar5 = pIVar26->m_opcode;
                if (OVar5 < ADD) {
                  bVar12 = OVar5 == MultiBr || OVar5 == Br;
                }
                else {
                  bVar12 = LowererMD::IsUnconditionalBranch(pIVar26);
                }
                if (bVar12 == false) goto LAB_005820e6;
              }
              else {
LAB_005820e6:
                bVar12 = OpCodeAttr::HasFallThrough(pIVar26->m_opcode);
                if (bVar12) {
                  Memory::
                  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,LoweredBasicBlock>
                            ((AllocatorType *)local_168,this->currentBlock);
                }
              }
              pLVar21 = this->lastLabel->m_loweredBasicBlock;
LAB_00582115:
              this->currentBlock = pLVar21;
            }
LAB_0058211c:
            this->currentRegion = this->lastLabel->m_region;
          }
LAB_00582131:
          bVar12 = false;
        }
        bVar13 = RemoveDeadStores(this,(Instr *)bailInInstr);
        if (!bVar13) {
          if ((((bailInInstr->super_LabelInstr).super_Instr.field_0x38 & 0x10) != 0) &&
             (pBVar27 = IR::Instr::GetBailOutInfo((Instr *)bailInInstr),
             pBVar27->bailOutRecord == (BailOutRecord *)0x0)) {
            if (DAT_015b5f89 == '\x01') {
              pcVar8 = (bailInInstr->super_LabelInstr).super_Instr.globOptInstrString;
              this_01 = bailInInstr;
              while (pcVar8 == (char16 *)0x0) {
                this_01 = (GeneratorBailInInstr *)(this_01->super_LabelInstr).super_Instr.m_prev;
                pcVar8 = (this_01->super_LabelInstr).super_Instr.globOptInstrString;
              }
              IR::Instr::Dump((Instr *)bailInInstr);
              IR::Instr::DumpGlobOptInstrString((Instr *)this_01);
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                ,0xeb,"(false)","Lazy bailout: bailOutRecord not allocated");
            if (!bVar13) goto LAB_005826f2;
            *puVar22 = 0;
          }
          if ((((bailInInstr->super_LabelInstr).super_Instr.field_0x38 & 0x10) != 0) &&
             (bVar13 = IR::Instr::HasLazyBailOut((Instr *)bailInInstr), !bVar13)) {
            if ((this->currentRegion != (Region *)0x0) &&
               ((byte)(this->currentRegion->type - RegionTypeTry) < 3)) {
              puVar3 = &this->func->field_0x240;
              *(uint *)puVar3 = *(uint *)puVar3 | 0x20;
            }
            FillBailOutRecord(this,(Instr *)bailInInstr);
          }
          SetSrcRegs(this,(Instr *)bailInInstr);
          EndDeadLifetimes(this,(Instr *)bailInInstr,bVar12);
          if ((bailInInstr->super_LabelInstr).super_Instr.m_kind == InstrKindBranch) {
            ProcessSecondChanceBoundary(this,(BranchInstr *)bailInInstr);
          }
          CheckIfInLoop(this,(Instr *)bailInInstr);
          if (bVar12 != false) {
            EndDeadLifetimes(this,(Instr *)bailInInstr,false);
          }
          CheckOpHelper(this,(Instr *)bailInInstr);
          KillImplicitRegs(this,(Instr *)bailInInstr);
          ProcessLazyBailOut(this,(Instr *)bailInInstr);
          AllocateNewLifetimes(this,(Instr *)bailInInstr);
          SetDstReg(this,(Instr *)bailInInstr);
          EndDeadOpHelperLifetimes(this,(Instr *)bailInInstr);
          IVar4 = (bailInInstr->super_LabelInstr).super_Instr.m_kind;
          if ((IVar4 == InstrKindProfiledLabel) || (IVar4 == InstrKindLabel)) {
            ProcessSecondChanceBoundary(this,&bailInInstr->super_LabelInstr);
          }
          CheckInvariants(this);
          IVar4 = (bailInInstr->super_LabelInstr).super_Instr.m_kind;
          bVar12 = true;
          if ((((IVar4 != InstrKindBranch) && (IVar4 != InstrKindExit)) &&
              (OVar5 = (bailInInstr->super_LabelInstr).super_Instr.m_opcode, 2 < OVar5 - 0x23)) &&
             (1 < OVar5 - 0x173)) {
            bVar12 = bVar11;
          }
          bVar11 = bVar12;
          if ((bailInInstr->super_LabelInstr).super_Instr.m_opcode == GeneratorBailInLabel) {
            pGVar28 = (GeneratorBailInInstr *)
                      GeneratorBailIn::GenerateBailIn(&this->bailIn,bailInInstr);
          }
        }
      }
      bailInInstr = pGVar28;
    } while (pGVar28 != (GeneratorBailInInstr *)0x0);
  }
  allocator = __autoCodeGen._8_8_;
  if ((this->func->field_0x240 & 0x10) != 0) {
    uVar31 = 0;
    do {
      if ((this->globalBailOutRecordTables[uVar31] != (GlobalBailOutRecordDataTable *)0x0) &&
         (GlobalBailOutRecordDataTable::Finalize
                    (this->globalBailOutRecordTables[uVar31],(Allocator *)allocator,
                     (JitArenaAllocator *)local_168), DAT_015c7943 == '\x01')) {
        uVar30 = (ulong)this->globalBailOutRecordTables[uVar31]->length;
        pSVar7 = this->func->m_scriptContextInfo;
        pSVar2 = pSVar7 + 0x120;
        pSVar2->_vptr_ScriptContextInfo = pSVar2->_vptr_ScriptContextInfo + uVar30 * 2;
        pSVar7 = pSVar7 + 0x11f;
        pSVar7->_vptr_ScriptContextInfo = pSVar7->_vptr_ScriptContextInfo + uVar30 * 2;
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 <= this->func->m_inlineeId);
  }
  if (this->floatRegUsedCount + this->intRegUsedCount != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar22 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                        ,0x13b,
                        "((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func))"
                        ,"RegUsedCount is wrong");
    if (!bVar11) goto LAB_005826f2;
    *puVar22 = 0;
  }
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->activeLiveranges->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this->activeLiveranges) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar22 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                        ,0x13c,"(this->activeLiveranges->Empty())","Active list not empty");
    if (!bVar11) goto LAB_005826f2;
    *puVar22 = 0;
  }
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->stackPackInUseLiveRanges->
      super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this->stackPackInUseLiveRanges) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar22 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                        ,0x13d,"(this->stackPackInUseLiveRanges->Empty())","Spilled list not empty")
    ;
    if (!bVar11) goto LAB_005826f2;
    *puVar22 = 0;
  }
  pSVar9 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
           (this->opHelperBlockIter).current;
  if ((pSVar9 != (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (pSVar9 != (this->opHelperBlockIter).list)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar22 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                        ,0x13f,"(!this->opHelperBlockIter.IsValid())",
                        "Got to the end with a helper block still on the list?");
    if (!bVar11) goto LAB_005826f2;
    *puVar22 = 0;
  }
  if ((this->currentBlock->inlineeStack).
      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar22 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                        ,0x141,"(this->currentBlock->inlineeStack.Count() == 0)",
                        "this->currentBlock->inlineeStack.Count() == 0");
    if (!bVar11) {
LAB_005826f2:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar22 = 0;
  }
  LinearScanMD::InsertOpHelperSpillAndRestores(&this->linearScanMD,this->opHelperBlockList);
  pJVar24 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar16 = JITTimeFunctionBody::GetSourceContextId(pJVar24);
  pFVar25 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar17 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015ca868,LinearScanPhase,uVar16,uVar17);
  if (bVar11) {
    PrintStats(this);
  }
  pJVar24 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar16 = JITTimeFunctionBody::GetSourceContextId(pJVar24);
  pFVar25 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar17 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,StackPackPhase,uVar16,uVar17);
  if (bVar11) {
    Output::Print(L"---------------------------\n");
  }
  this->func->allowRemoveBailOutArgInstr = true;
  SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::~SList
            ((SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
             &liveness.lifetimeList.allocator);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::~SList
            ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
             &liveness.extendedLifetimesLoopList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_168);
  return;
}

Assistant:

void
LinearScan::RegAlloc()
{
    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LinearScan"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->tempAlloc = &tempAlloc;
    this->opHelperSpilledLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->activeLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->liveOnBackEdgeSyms = JitAnew(&tempAlloc, BVSparse<JitArenaAllocator>, &tempAlloc);
    this->stackPackInUseLiveRanges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->stackSlotsFreeList = JitAnew(&tempAlloc, SList<StackSlot *>, &tempAlloc);
    this->currentBlock = LoweredBasicBlock::New(&tempAlloc);

    IR::Instr *currentInstr = this->func->m_headInstr;

    SCCLiveness liveness(this->func, this->tempAlloc);
    BEGIN_CODEGEN_PHASE(this->func, Js::LivenessPhase);

    // Build the lifetime list
    liveness.Build();
    END_CODEGEN_PHASE(this->func, Js::LivenessPhase);


    this->lifetimeList = &liveness.lifetimeList;

    this->opHelperBlockList = &liveness.opHelperBlockList;
    this->opHelperBlockIter = SList<OpHelperBlock>::Iterator(this->opHelperBlockList);
    this->opHelperBlockIter.Next();

    this->Init();

    NativeCodeData::Allocator * nativeAllocator = this->func->GetNativeCodeDataAllocator();
    if (func->hasBailout)
    {
        this->globalBailOutRecordTables = NativeCodeDataNewArrayZ(nativeAllocator, GlobalBailOutRecordDataTable *,  func->m_inlineeId + 1);
        this->lastUpdatedRowIndices = JitAnewArrayZ(this->tempAlloc, uint *, func->m_inlineeId + 1);

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            this->func->GetScriptContext()->bailOutOffsetBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
            this->func->GetScriptContext()->bailOutRecordBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
        }
#endif
    }

    m_bailOutRecordCount = 0;
    bool endOfBasicBlock = true;
    FOREACH_INSTR_EDITING(instr, instrNext, currentInstr)
    {
        if (instr->GetNumber() == 0)
        {
            AssertMsg(LowererMD::IsAssign(instr), "Only expect spill code here");
            continue;
        }

#if DBG_DUMP && defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
        {
            instr->Dump();
        }
#endif // DBG

        this->currentInstr = instr;
        if (instr->StartsBasicBlock() || endOfBasicBlock)
        {
            endOfBasicBlock = false;
            ++currentBlockNumber;
        }

        bool isLoopBackEdge = false;
        if (instr->IsLabelInstr())
        {
            this->lastLabel = instr->AsLabelInstr();
            if (this->lastLabel->m_loweredBasicBlock)
            {
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (prevInstr->HasFallThrough())
                {
                    this->currentBlock->Delete(&tempAlloc);
                }
                this->currentBlock = this->lastLabel->m_loweredBasicBlock;
            }
            else if (currentBlock->HasData())
            {
                // Check if the previous block has fall-through. If so, retain the block info. If not, create empty info.
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (!prevInstr->HasFallThrough())
                {
                    currentBlock = LoweredBasicBlock::New(&tempAlloc);
                }
            }
            this->currentRegion = this->lastLabel->GetRegion();
        }
        else if (instr->IsBranchInstr())
        {
            if (this->func->HasTry() && this->func->DoOptimizeTry())
            {
                this->ProcessEHRegionBoundary(instr);
            }

            isLoopBackEdge = this->IsInLoop() && instr->GetNumber() >= this->curLoop->regAlloc.loopEnd;
        }

        if (this->RemoveDeadStores(instr))
        {
            continue;
        }

#if DBG
        // Since not all call instructions are forwarded to ChangeToHelperCall, we might have
        // missed allocating bailout records for them. Additionally, some instructions might
        // end up being lowered differently, so the lazy bailout is not on a CALL instruction
        // anymore. Use this opportunity to detect them.
        // Note that the dump for the instruction will also be printed with -ForcePostLowerGlobOptInstrString
        if (instr->HasBailOutInfo() && instr->GetBailOutInfo()->bailOutRecord == nullptr)
        {
            if (CONFIG_FLAG(ForcePostLowerGlobOptInstrString))
            {
                // The instruction has already been lowered, find the start to get the globopt dump
                IR::Instr *curr = instr;
                while (curr->globOptInstrString == nullptr)
                {
                    curr = curr->m_prev;
                }

                instr->Dump();
                curr->DumpGlobOptInstrString();
            }

            AssertMsg(false, "Lazy bailout: bailOutRecord not allocated");
        }
#endif

        if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
        {
            if (this->currentRegion)
            {
                RegionType curRegType = this->currentRegion->GetType();
                if (curRegType == RegionTypeTry || curRegType == RegionTypeCatch || curRegType == RegionTypeFinally)
                {
                    this->func->hasBailoutInEHRegion = true;
                }
            }

            this->FillBailOutRecord(instr);
        }

        this->SetSrcRegs(instr);
        this->EndDeadLifetimes(instr, isLoopBackEdge);

        if (instr->IsBranchInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsBranchInstr());
        }
        this->CheckIfInLoop(instr);
        if (isLoopBackEdge)
        {
            this->EndDeadLifetimes(instr, false);
        }

        this->CheckOpHelper(instr);

        this->KillImplicitRegs(instr);

        this->ProcessLazyBailOut(instr);

        this->AllocateNewLifetimes(instr);
        this->SetDstReg(instr);

        this->EndDeadOpHelperLifetimes(instr);

        if (instr->IsLabelInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsLabelInstr());
        }

#if DBG
        this->CheckInvariants();
#endif // DBG

        if(instr->EndsBasicBlock())
        {
            endOfBasicBlock = true;
        }

        if (instr->IsGeneratorBailInInstr())
        {
            instrNext = this->bailIn.GenerateBailIn(instr->AsGeneratorBailInInstr());
        }
    } NEXT_INSTR_EDITING;

    if (func->hasBailout)
    {
        for (uint i = 0; i <= func->m_inlineeId; i++)
        {
            if (globalBailOutRecordTables[i] != nullptr)
            {
                globalBailOutRecordTables[i]->Finalize(nativeAllocator, &tempAlloc);
#ifdef PROFILE_BAILOUT_RECORD_MEMORY
                if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
                {
                    func->GetScriptContext()->bailOutOffsetBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                    func->GetScriptContext()->bailOutRecordBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                }
#endif
            }
        }
    }

    AssertMsg((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func) , "RegUsedCount is wrong");
    AssertMsg(this->activeLiveranges->Empty(), "Active list not empty");
    AssertMsg(this->stackPackInUseLiveRanges->Empty(), "Spilled list not empty");

    AssertMsg(!this->opHelperBlockIter.IsValid(), "Got to the end with a helper block still on the list?");

    Assert(this->currentBlock->inlineeStack.Count() == 0);
    this->InsertOpHelperSpillAndRestores();

#if _M_IX86
# if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.Instrument.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(),this->func->GetLocalFunctionId()))
    {
        this->DynamicStatsInstrument();
    }
# endif
#endif

#if DBG_DUMP
    if (PHASE_STATS(Js::LinearScanPhase, this->func))
    {
        this->PrintStats();
    }
    if (PHASE_TRACE(Js::StackPackPhase, this->func))
    {
        Output::Print(_u("---------------------------\n"));
    }
#endif // DBG_DUMP
    DebugOnly(this->func->allowRemoveBailOutArgInstr = true);
}